

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O3

void fpconv_init(void)

{
  undefined1 *puVar1;
  int iVar2;
  char *__s;
  size_t __size;
  char buf [8];
  char local_10;
  char local_f;
  char local_e;
  char local_d;
  
  __s = &local_10;
  iVar2 = 8;
  snprintf(__s,8,"%g",0x3fe0000000000000);
  if (((local_10 == '0') && (local_e == '5')) && (local_d == '\0')) {
    locale_decimal_point = local_f;
    return;
  }
  fpconv_init_cold_1();
  __size = 0x3ff;
  if (0 < iVar2) {
    __size = (size_t)(iVar2 + 1);
  }
  *(int *)(__s + 8) = (int)__size;
  __s[0xc] = '\0';
  __s[0xd] = '\0';
  __s[0xe] = '\0';
  __s[0xf] = '\0';
  __s[0x10] = -2;
  __s[0x11] = -1;
  __s[0x12] = -1;
  __s[0x13] = -1;
  __s[0x14] = '\0';
  __s[0x15] = '\0';
  __s[0x16] = '\0';
  __s[0x17] = '\0';
  __s[0x18] = '\0';
  __s[0x19] = '\0';
  __s[0x1a] = '\0';
  __s[0x1b] = '\0';
  __s[0x1c] = '\0';
  __s[0x1d] = '\0';
  __s[0x1e] = '\0';
  __s[0x1f] = '\0';
  puVar1 = (undefined1 *)malloc(__size);
  *(undefined1 **)__s = puVar1;
  if (puVar1 != (undefined1 *)0x0) {
    *puVar1 = 0;
    return;
  }
  die("Out of memory");
}

Assistant:

static void fpconv_update_locale()
{
    char buf[8];

    snprintf(buf, sizeof(buf), "%g", 0.5);

    /* Failing this test might imply the platform has a buggy dtoa
     * implementation or wide characters */
    if (buf[0] != '0' || buf[2] != '5' || buf[3] != 0) {
        fprintf(stderr, "Error: wide characters found or printf() bug.");
        abort();
    }

    locale_decimal_point = buf[1];
}